

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_fsp.cpp
# Opt level: O2

void * __thiscall ON_FixedSizePool::ThreadSafeAllocateElement(ON_FixedSizePool *this)

{
  bool bVar1;
  void *pvVar2;
  
  bVar1 = ON_SleepLock::GetLock(&this->m_sleep_lock);
  if (bVar1) {
    pvVar2 = AllocateElement(this);
    ON_SleepLock::ReturnLock(&this->m_sleep_lock);
  }
  else {
    pvVar2 = (void *)0x0;
  }
  return pvVar2;
}

Assistant:

void* ON_FixedSizePool::ThreadSafeAllocateElement()
{
  void* p = nullptr;
  {
    if ( m_sleep_lock.GetLock() )
    {
      p = AllocateElement();
      m_sleep_lock.ReturnLock();
    }
  }
  return p;
}